

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

recursive_directory_iterator * __thiscall
ghc::filesystem::recursive_directory_iterator::operator++(recursive_directory_iterator *this)

{
  bool bVar1;
  undefined8 uVar2;
  path *this_00;
  directory_entry *this_01;
  string *in_RDI;
  filesystem_error *unaff_retaddr;
  error_code in_stack_00000008;
  error_code ec;
  int in_stack_000001ac;
  path *in_stack_ffffffffffffff58;
  error_code *in_stack_ffffffffffffff60;
  error_category *in_stack_fffffffffffffff0;
  string *what_arg;
  
  what_arg = in_RDI;
  std::error_code::error_code(in_stack_ffffffffffffff60);
  increment((recursive_directory_iterator *)unaff_retaddr,(error_code *)what_arg);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    return (recursive_directory_iterator *)in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value((error_code *)&stack0xffffffffffffffe8);
  detail::systemErrorText<int>(in_stack_000001ac);
  std::
  __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2935aa);
  bVar1 = std::
          stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
          ::empty((stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
                   *)0x2935b6);
  if (bVar1) {
    path::path((path *)0x2935d0);
  }
  else {
    std::
    __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2935dc);
    this_00 = (path *)std::
                      stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
                      ::top((stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
                             *)0x2935e8);
    this_01 = directory_iterator::operator->((directory_iterator *)0x2935f9);
    directory_entry::path(this_01);
    path::path(this_00,in_stack_ffffffffffffff58);
  }
  filesystem_error::filesystem_error
            (unaff_retaddr,what_arg,(path *)in_stack_fffffffffffffff0,in_stack_00000008);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE recursive_directory_iterator& recursive_directory_iterator::operator++()
{
    std::error_code ec;
    increment(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _impl->_dir_iter_stack.empty() ? path() : _impl->_dir_iter_stack.top()->path(), ec);
    }
    return *this;
}